

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row_template_begin(nk_context *ctx,float height)

{
  long lVar1;
  long in_RDI;
  nk_panel *layout;
  nk_window *win;
  undefined4 in_stack_00000018;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8);
    nk_panel_layout(ctx,(nk_window *)CONCAT44(height,in_stack_00000018),win._4_4_,(int)win);
    *(undefined4 *)(lVar1 + 0x70) = 8;
    *(undefined4 *)(lVar1 + 0x80) = 0;
    *(undefined8 *)(lVar1 + 0x88) = 0;
    *(undefined4 *)(lVar1 + 0x90) = 0;
    *(undefined4 *)(lVar1 + 0x94) = 0;
    *(undefined4 *)(lVar1 + 0x98) = 0;
    *(undefined4 *)(lVar1 + 0x9c) = 0;
    *(undefined4 *)(lVar1 + 0xa0) = 0;
    *(undefined4 *)(lVar1 + 0xa4) = 0;
    *(undefined4 *)(lVar1 + 0xa8) = 0;
    *(undefined4 *)(lVar1 + 0xac) = 0;
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_template_begin(struct nk_context *ctx, float height)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
nk_panel_layout(ctx, win, height, 1);
layout->row.type = NK_LAYOUT_TEMPLATE;
layout->row.columns = 0;
layout->row.ratio = 0;
layout->row.item_width = 0;
layout->row.item_height = 0;
layout->row.item_offset = 0;
layout->row.filled = 0;
layout->row.item.x = 0;
layout->row.item.y = 0;
layout->row.item.w = 0;
layout->row.item.h = 0;
}